

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# settings_pack.cpp
# Opt level: O0

settings_pack * libtorrent::default_settings(void)

{
  int name;
  ulong uVar1;
  value_type *pvVar2;
  value_type *pvVar3;
  value_type *pvVar4;
  settings_pack *in_RDI;
  int local_50;
  int local_4c;
  int i_2;
  int i_1;
  int local_18;
  undefined1 local_11;
  int i;
  settings_pack *ret;
  
  local_11 = 0;
  settings_pack::settings_pack(in_RDI);
  for (local_18 = 0; local_18 < 0xd; local_18 = local_18 + 1) {
    aux::
    container_wrapper<libtorrent::str_setting_entry_t,_long,_std::array<libtorrent::str_setting_entry_t,_13UL>_>
    ::operator[]((container_wrapper<libtorrent::str_setting_entry_t,_long,_std::array<libtorrent::str_setting_entry_t,_13UL>_>
                  *)(anonymous_namespace)::str_settings,(long)local_18);
    uVar1 = ::std::__cxx11::string::empty();
    name = local_18;
    if ((uVar1 & 1) == 0) {
      pvVar2 = aux::
               container_wrapper<libtorrent::str_setting_entry_t,_long,_std::array<libtorrent::str_setting_entry_t,_13UL>_>
               ::operator[]((container_wrapper<libtorrent::str_setting_entry_t,_long,_std::array<libtorrent::str_setting_entry_t,_13UL>_>
                             *)(anonymous_namespace)::str_settings,(long)local_18);
      ::std::__cxx11::string::string((string *)&i_2,(string *)&pvVar2->default_value);
      settings_pack::set_str(in_RDI,name,(string *)&i_2);
      ::std::__cxx11::string::~string((string *)&i_2);
    }
  }
  for (local_4c = 0; local_4c < 0x9f; local_4c = local_4c + 1) {
    pvVar3 = aux::
             container_wrapper<libtorrent::int_setting_entry_t,_long,_std::array<libtorrent::int_setting_entry_t,_159UL>_>
             ::operator[]((container_wrapper<libtorrent::int_setting_entry_t,_long,_std::array<libtorrent::int_setting_entry_t,_159UL>_>
                           *)(anonymous_namespace)::int_settings,(long)local_4c);
    settings_pack::set_int(in_RDI,local_4c + 0x4000,pvVar3->default_value);
  }
  for (local_50 = 0; local_50 < 0x54; local_50 = local_50 + 1) {
    pvVar4 = aux::
             container_wrapper<libtorrent::bool_setting_entry_t,_long,_std::array<libtorrent::bool_setting_entry_t,_84UL>_>
             ::operator[]((container_wrapper<libtorrent::bool_setting_entry_t,_long,_std::array<libtorrent::bool_setting_entry_t,_84UL>_>
                           *)(anonymous_namespace)::bool_settings,(long)local_50);
    settings_pack::set_bool(in_RDI,local_50 + 0x8000,(bool)(pvVar4->default_value & 1));
  }
  return in_RDI;
}

Assistant:

settings_pack default_settings()
	{
		settings_pack ret;
		// TODO: it would be nice to reserve() these vectors up front
		for (int i = 0; i < settings_pack::num_string_settings; ++i)
		{
			if (str_settings[i].default_value.empty()) continue;
			ret.set_str(settings_pack::string_type_base + i, str_settings[i].default_value);
		}

		for (int i = 0; i < settings_pack::num_int_settings; ++i)
		{
			ret.set_int(settings_pack::int_type_base + i, int_settings[i].default_value);
		}

		for (int i = 0; i < settings_pack::num_bool_settings; ++i)
		{
			ret.set_bool(settings_pack::bool_type_base + i, bool_settings[i].default_value);
		}
		return ret;
	}